

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O1

void free_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  uint32_t uVar1;
  char **__ptr;
  char *__ptr_00;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = (node->base).refcount;
  if (uVar1 != 0) {
    (node->base).refcount = uVar1 - 1;
    return;
  }
  if (node->identifiers == (cstring_r *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = node->identifiers->n;
  }
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      if (uVar3 < node->identifiers->n) {
        __ptr_00 = node->identifiers->p[uVar3];
      }
      else {
        __ptr_00 = (char *)0x0;
      }
      free(__ptr_00);
      uVar3 = uVar3 + 1;
    } while (sVar2 != uVar3);
  }
  if (node->identifiers != (cstring_r *)0x0) {
    __ptr = node->identifiers->p;
    if (__ptr != (char **)0x0) {
      free(__ptr);
    }
    free(node->identifiers);
  }
  free(node);
  return;
}

Assistant:

static void free_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    #pragma unused(self)
    CHECK_REFCOUNT(node);
    cstring_array_each(node->identifiers, {
        mem_free((void *)val);
    });

    if (node->identifiers) gnode_array_free(node->identifiers);
    mem_free((void *)node);
}